

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Statement * __thiscall soul::StructuralParser::getNoop(StructuralParser *this)

{
  bool bVar1;
  NoopStatement *o;
  Statement *pSVar2;
  Context local_38;
  pool_ptr<soul::AST::NoopStatement> local_18;
  StructuralParser *local_10;
  StructuralParser *this_local;
  
  local_10 = this;
  bVar1 = pool_ptr<soul::AST::NoopStatement>::operator==(&this->noop,(void *)0x0);
  if (bVar1) {
    local_38.location.sourceCode.object = (SourceCodeText *)0x0;
    local_38.location.location.data = (char *)0x0;
    local_38.parentScope = (Scope *)0x0;
    AST::Context::Context(&local_38);
    o = allocate<soul::AST::NoopStatement,soul::AST::Context>(this,&local_38);
    pool_ptr<soul::AST::NoopStatement>::pool_ptr<soul::AST::NoopStatement,void>(&local_18,o);
    (this->noop).object = local_18.object;
    pool_ptr<soul::AST::NoopStatement>::~pool_ptr(&local_18);
    AST::Context::~Context(&local_38);
  }
  pSVar2 = &pool_ptr<soul::AST::NoopStatement>::operator*(&this->noop)->super_Statement;
  return pSVar2;
}

Assistant:

AST::Statement& getNoop()     { if (noop == nullptr) noop = allocate<AST::NoopStatement> (AST::Context()); return *noop; }